

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

int xmlPythonFileCloseRaw(void *context)

{
  PyObject *op;
  int iVar1;
  
  if (context == (void *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    op = (PyObject *)_PyObject_CallMethod_SizeT(context,"close","()");
    if (op != (PyObject *)0x0) {
      _Py_DECREF(op);
    }
    _Py_DECREF((PyObject *)context);
  }
  return iVar1;
}

Assistant:

static int
xmlPythonFileCloseRaw (void * context) {
    PyObject *file, *ret;

    file = (PyObject *) context;
    if (file == NULL) return(-1);
    ret = PyObject_CallMethod(file, (char *) "close", (char *) "()");
    if (ret != NULL) {
	Py_DECREF(ret);
    }
    Py_DECREF(file);
    return(0);
}